

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

ssize_t sf_parse_token(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  bool bVar1;
  byte *local_30;
  uint8_t *p;
  uint8_t *end_local;
  uint8_t *begin_local;
  nghttp2_sf_value *dest_local;
  
  local_30 = begin;
  if ((((*begin < 0x41) || (0x5a < *begin)) && ((*begin < 0x61 || (0x7a < *begin)))) &&
     (*begin != '*')) {
    dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (local_30 != end) {
        bVar1 = SF_TOKEN_CHARS[*local_30] != 0;
      }
      if (!bVar1) break;
      local_30 = local_30 + 1;
    }
    if (dest != (nghttp2_sf_value *)0x0) {
      dest->type = '\x04';
      (dest->field_1).s.base = begin;
      (dest->field_1).s.len = (long)local_30 - (long)begin;
    }
    dest_local = (nghttp2_sf_value *)(local_30 + -(long)begin);
  }
  return (ssize_t)dest_local;
}

Assistant:

static ssize_t sf_parse_token(nghttp2_sf_value *dest, const uint8_t *begin,
                              const uint8_t *end) {
  const uint8_t *p = begin;

  if ((*p < 'A' || 'Z' < *p) && (*p < 'a' || 'z' < *p) && *p != '*') {
    return -1;
  }

  for (; p != end && SF_TOKEN_CHARS[*p]; ++p)
    ;

  if (dest) {
    dest->type = NGHTTP2_SF_VALUE_TYPE_TOKEN;
    dest->s.base = begin;
    dest->s.len = (size_t)(p - begin);
  }

  return p - begin;
}